

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall
QTableViewPrivate::drawAndClipSpans
          (QTableViewPrivate *this,QRegion *area,QPainter *painter,QStyleOptionViewItem *option,
          QBitArray *drawn,int firstVisualRow,int lastVisualRow,int firstVisualColumn,
          int lastVisualColumn)

{
  QPoint QVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  Data *pDVar3;
  Span *span;
  QAbstractItemModel *pQVar4;
  ulong uVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  LayoutDirection LVar11;
  int iVar12;
  undefined8 extraout_RDX;
  int logicalIndex;
  QHash<QSpanCollection::Span_*,_QHashDummyValue> QVar13;
  Data *pDVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  Representation RVar16;
  Representation RVar17;
  QRect QVar18;
  R_conflict2 RVar19;
  QRegion region;
  QHash<QSpanCollection::Span_*,_QHashDummyValue> moved;
  QRegion local_150;
  undefined1 local_148 [12];
  Representation RStack_13c;
  QSpanCollection local_138;
  QHash<QSpanCollection::Span_*,_QHashDummyValue> local_118;
  QRegion local_110;
  undefined1 local_108 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_f8;
  Representation RStack_f0;
  Representation RStack_ec;
  QFont local_b0 [20];
  QFlagsStorage<QStyleOptionViewItem::ViewItemFeature> local_9c;
  QLocale local_98 [6];
  QIcon local_68;
  QArrayData *local_60;
  QBrush local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  local_110.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  local_108._8_8_ =
       CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
  local_108._0_8_ = (Data *)0x0;
  QRegion::QRegion(&local_110,(QRect *)local_108,Rectangle);
  local_118.d = (Data *)0x0;
  bVar6 = QHeaderView::sectionsMoved(this->verticalHeader);
  if ((bVar6) || (bVar6 = QHeaderView::sectionsMoved(this->horizontalHeader), bVar6)) {
    local_f8.ptr = (QAbstractItemModel *)0x0;
    local_108._0_8_ = (Data *)local_108;
    local_108._8_8_ = (Data *)local_108;
    std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>::
    _M_initialize_dispatch<std::_List_const_iterator<QSpanCollection::Span*>>
              ((list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>> *)local_108,
               (this->spans).spans.
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node.super__List_node_base._M_next,&this->spans);
    pDVar3 = (Data *)local_108._0_8_;
    if ((Data *)local_108._0_8_ != (Data *)local_108) {
      pDVar14 = (Data *)local_108._0_8_;
      do {
        pDVar3 = (Data *)pDVar14->numBuckets;
        iVar8 = QHeaderView::visualIndex
                          (this->horizontalHeader,((Representation *)&pDVar3->field_0x4)->m_i);
        iVar9 = QHeaderView::visualIndex
                          (this->verticalHeader,
                           (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i);
        if ((((iVar9 <= lastVisualRow) && (iVar8 <= lastVisualColumn)) &&
            (firstVisualColumn <
             ((iVar8 + ((Representation *)&pDVar3->size)[1].m_i) -
             ((Representation *)&pDVar3->field_0x4)->m_i) + 1)) &&
           (firstVisualRow <
            ((iVar9 + ((Representation *)&pDVar3->size)->m_i) -
            (pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i) + 1)) {
          local_138.spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pDVar3;
          QHash<QSpanCollection::Span*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QSpanCollection::Span*,QHashDummyValue> *)&local_118,(Span **)&local_138
                     ,(QHashDummyValue *)local_148);
        }
        pDVar14 = *(Data **)pDVar14;
        pDVar3 = (Data *)local_108._0_8_;
      } while (pDVar14 != (Data *)local_108);
    }
    while (pDVar3 != (Data *)local_108) {
      pDVar14 = *(Data **)pDVar3;
      operator_delete(pDVar3,0x18);
      pDVar3 = pDVar14;
    }
  }
  else {
    iVar8 = QHeaderView::logicalIndex(this->horizontalHeader,firstVisualColumn);
    iVar9 = QHeaderView::logicalIndex(this->verticalHeader,firstVisualRow);
    QSpanCollection::spansInRect
              (&local_138,(int)this + 0x650,iVar8,iVar9,(lastVisualColumn - firstVisualColumn) + 1);
    local_108._0_8_ = local_118.d;
    local_118.d = (Data *)local_138.spans.
                          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                          ._M_impl._M_node.super__List_node_base._M_next;
    local_138.spans.
    super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash
              ((QHash<QSpanCollection::Span_*,_QHashDummyValue> *)local_108);
    QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash
              ((QHash<QSpanCollection::Span_*,_QHashDummyValue> *)&local_138);
  }
  if (local_118.d == (Data *)0x0) {
    QVar13.d = (Data *)0x0;
  }
  else {
    QVar13.d = local_118.d;
    if ((local_118.d)->spans->offsets[0] == 0xff) {
      uVar5 = 1;
      do {
        uVar15 = uVar5;
        if ((local_118.d)->numBuckets == uVar15) {
          QVar13.d = (Data *)0x0;
          uVar15 = 0;
          break;
        }
        uVar5 = uVar15 + 1;
      } while ((local_118.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
      goto LAB_00590438;
    }
  }
  uVar15 = 0;
LAB_00590438:
  if (QVar13.d != (Data *)0x0 || uVar15 != 0) {
    do {
      span = *(Span **)(QVar13.d)->spans[uVar15 >> 7].entries
                       [(QVar13.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f]].storage.data;
      iVar8 = span->m_top;
      iVar9 = span->m_left;
      local_138.spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node._M_size = (size_t)&DAT_aaaaaaaaaaaaaaaa;
      local_138.spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
      local_138.spans.
      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
      _M_node.super__List_node_base._M_prev = (_List_node_base *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (this->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)local_108,&(this->super_QAbstractItemViewPrivate).root);
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_138,pQVar4,iVar8,iVar9,(QModelIndex *)local_108);
      if (((-1 < (int)local_138.spans.
                      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next) &&
          (-1 < (long)local_138.spans.
                      super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                      ._M_impl._M_node.super__List_node_base._M_next)) &&
         ((undefined1 *)
          local_138.spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node._M_size != (undefined1 *)0x0)) {
        stack0xfffffffffffffec0 = &DAT_aaaaaaaaaaaaaaaa;
        local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QVar18 = visualSpanRect(this,span);
        QVar1 = (this->super_QAbstractItemViewPrivate).scrollDelayOffset;
        RVar16 = QVar1.xp.m_i;
        RVar17 = QVar1.yp.m_i;
        local_148._0_4_ = QVar18.x1.m_i;
        local_148._4_4_ = QVar18.y1.m_i;
        local_148._8_4_ = QVar18.x2.m_i;
        RStack_13c = QVar18.y2.m_i;
        local_148._4_4_ = RVar17.m_i + local_148._4_4_;
        local_148._0_4_ = RVar16.m_i + local_148._0_4_;
        local_148._8_4_ = RVar16.m_i + local_148._8_4_;
        RStack_13c.m_i = RVar17.m_i + RStack_13c.m_i;
        cVar7 = QRegion::intersects((QRect *)area);
        if (cVar7 != '\0') {
          memset((QStyleOptionViewItem *)local_108,0xaa,0xd0);
          QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)local_108,option);
          QVar18 = _local_148;
          local_f8.ptr = (QAbstractItemModel *)local_148._0_8_;
          RStack_f0.m_i = local_148._8_4_;
          RStack_ec.m_i = RStack_13c.m_i;
          uVar10 = 0;
          if ((this->super_QAbstractItemViewPrivate).alternatingColors == true) {
            uVar10 = span->m_top * 2 & 2;
          }
          local_9c.i = local_9c.i & 0xfffffffd | uVar10;
          _local_148 = QVar18;
          drawCell(this,painter,(QStyleOptionViewItem *)local_108,(QModelIndex *)&local_138);
          if (this->showGrid == true) {
            iVar9 = QHeaderView::visualIndex(this->horizontalHeader,iVar8);
            if (iVar9 == 0) {
              local_148._4_4_ = local_148._4_4_ + 1;
            }
            iVar8 = QHeaderView::visualIndex(this->verticalHeader,iVar8);
            if (iVar8 == 0) {
              LVar11 = QWidget::layoutDirection(this_00);
              if (LVar11 == LeftToRight) {
                local_148._0_4_ = local_148._0_4_ + 1;
              }
              else {
                local_148._8_4_ = local_148._8_4_ + -1;
              }
            }
          }
          QRegion::QRegion(&local_150,(QRect *)local_148,Rectangle);
          QRegion::operator-=(&local_110,&local_150);
          QRegion::~QRegion(&local_150);
          iVar8 = span->m_top;
          if (span->m_top <= span->m_bottom) {
            do {
              iVar9 = QHeaderView::visualIndex(this->verticalHeader,iVar8);
              if ((iVar9 <= lastVisualRow && firstVisualRow <= iVar9) &&
                 (span->m_left <= span->m_right)) {
                logicalIndex = span->m_left;
                do {
                  iVar12 = QHeaderView::visualIndex(this->horizontalHeader,logicalIndex);
                  if (lastVisualColumn >= iVar12 && iVar12 >= firstVisualColumn) {
                    RVar19 = QBitArray::bitLocation<QBitArray>
                                       (drawn,(QBitArray *)
                                              (long)(iVar12 + ((iVar9 - firstVisualRow) *
                                                               ((lastVisualColumn -
                                                                firstVisualColumn) + 1) -
                                                              firstVisualColumn)),
                                        CONCAT71((int7)((ulong)extraout_RDX >> 8),
                                                 lastVisualColumn < iVar12 ||
                                                 iVar12 < firstVisualColumn));
                    *RVar19.byte = *RVar19.byte | RVar19.bitMask;
                  }
                  bVar6 = logicalIndex < span->m_right;
                  logicalIndex = logicalIndex + 1;
                } while (bVar6);
              }
              bVar6 = iVar8 < span->m_bottom;
              iVar8 = iVar8 + 1;
            } while (bVar6);
          }
          QBrush::~QBrush(local_40);
          if (local_60 != (QArrayData *)0x0) {
            LOCK();
            (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_60,2,0x10);
            }
          }
          QIcon::~QIcon(&local_68);
          QLocale::~QLocale(local_98);
          QFont::~QFont(local_b0);
          QStyleOption::~QStyleOption((QStyleOption *)local_108);
        }
      }
      do {
        if ((QVar13.d)->numBuckets - 1 == uVar15) {
          QVar13.d = (Data *)0x0;
          uVar15 = 0;
          break;
        }
        uVar15 = uVar15 + 1;
      } while ((QVar13.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
    } while ((QVar13.d != (Data *)0x0) || (uVar15 != 0));
  }
  QPainter::setClipRegion((QRegion *)painter,(ClipOperation)&local_110);
  QHash<QSpanCollection::Span_*,_QHashDummyValue>::~QHash(&local_118);
  QRegion::~QRegion(&local_110);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableViewPrivate::drawAndClipSpans(const QRegion &area, QPainter *painter,
                                         const QStyleOptionViewItem &option, QBitArray *drawn,
                                         int firstVisualRow, int lastVisualRow, int firstVisualColumn, int lastVisualColumn)
{
    Q_Q(const QTableView);
    bool alternateBase = false;
    QRegion region = viewport->rect();

    QSet<QSpanCollection::Span *> visibleSpans;
    bool sectionMoved = verticalHeader->sectionsMoved() || horizontalHeader->sectionsMoved();

    if (!sectionMoved) {
        visibleSpans = spans.spansInRect(logicalColumn(firstVisualColumn), logicalRow(firstVisualRow),
                                         lastVisualColumn - firstVisualColumn + 1, lastVisualRow - firstVisualRow + 1);
    } else {
        // Any cell outside the viewport, on the top or left, can still end up visible inside the
        // viewport if is has a span. Calculating if a spanned cell overlaps with the viewport is
        // "easy" enough when the columns (or rows) in the view are aligned with the columns
        // in the model; In that case you know that if a column is outside the viewport on the
        // right, it cannot affect the drawing of the cells inside the viewport, even with a span.
        // And under that assumption, the spansInRect() function can be used (which is optimized
        // to only iterate the spans that are close to the viewport).
        // But when the view has rearranged the columns (or rows), this is no longer true. In that
        // case, even if a column, according to the model, is outside the viewport on the right, it
        // can still overlap with the viewport. This can happen if it was moved to the left of the
        // viewport and one of its cells has a span. In that case we need to take the theoretically
        // slower route and iterate through all the spans, and check if any of them overlaps with
        // the viewport.
        const auto spanList = spans.spans;
        for (QSpanCollection::Span *span : spanList) {
            const int spanVisualLeft = visualColumn(span->left());
            const int spanVisualTop = visualRow(span->top());
            const int spanVisualRight = spanVisualLeft + span->width() - 1;
            const int spanVisualBottom = spanVisualTop + span->height() - 1;
            if ((spanVisualLeft <= lastVisualColumn && spanVisualRight >= firstVisualColumn)
                    && (spanVisualTop <= lastVisualRow && spanVisualBottom >= firstVisualRow))
                visibleSpans.insert(span);
        }
    }

    for (QSpanCollection::Span *span : std::as_const(visibleSpans)) {
        int row = span->top();
        int col = span->left();
        QModelIndex index = model->index(row, col, root);
        if (!index.isValid())
            continue;
        QRect rect = visualSpanRect(*span);
        rect.translate(scrollDelayOffset);
        if (!area.intersects(rect))
            continue;
        QStyleOptionViewItem opt = option;
        opt.rect = rect;
        alternateBase = alternatingColors && (span->top() & 1);
        opt.features.setFlag(QStyleOptionViewItem::Alternate, alternateBase);
        drawCell(painter, opt, index);
        if (showGrid) {
            // adjust the clip rect to be able to paint the top & left grid lines
            // if the headers are not visible, see paintEvent()
            if (horizontalHeader->visualIndex(row) == 0)
                rect.setTop(rect.top() + 1);
            if (verticalHeader->visualIndex(row) == 0) {
                if (q->isLeftToRight())
                    rect.setLeft(rect.left() + 1);
                else
                    rect.setRight(rect.right() - 1);
            }
        }
        region -= rect;
        for (int r = span->top(); r <= span->bottom(); ++r) {
            const int vr = visualRow(r);
            if (vr < firstVisualRow || vr > lastVisualRow)
                continue;
            for (int c = span->left(); c <= span->right(); ++c) {
                const int vc = visualColumn(c);
                if (vc < firstVisualColumn  || vc > lastVisualColumn)
                    continue;
                drawn->setBit((vr - firstVisualRow) * (lastVisualColumn - firstVisualColumn + 1)
                             + vc - firstVisualColumn);
            }
        }

    }
    painter->setClipRegion(region);
}